

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O1

int vm_get_game_arg(int argc,char **argv,char *buf,size_t buflen,int *engine_type)

{
  char cVar1;
  int *__s;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  ulong uVar4;
  ulong __size;
  char *__s2;
  int iVar5;
  char *__filename;
  uint uVar6;
  undefined1 auVar7 [16];
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  undefined2 uStack_b0;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  
  *engine_type = -2;
  if (argc < 2) {
    __filename = (char *)0x0;
  }
  else {
    iVar5 = 1;
    __filename = (char *)0x0;
    do {
      __s = (int *)argv[iVar5];
      if ((char)*__s != '-') {
        sVar3 = strlen((char *)__s);
        uVar4 = buflen - 1;
        if (sVar3 < buflen - 1) {
          uVar4 = sVar3;
        }
        memcpy(buf,__s,uVar4);
        buf[uVar4] = '\0';
        return 1;
      }
      cVar1 = *(char *)((long)__s + 1);
      switch(cVar1) {
      case 'c':
        iVar2 = strcmp((char *)__s,"-ctab");
        if ((iVar2 != 0) && (iVar2 = strcmp((char *)__s,"-cs"), iVar2 != 0)) {
          __s2 = "-csl";
LAB_00201297:
          iVar2 = strcmp((char *)__s,__s2);
          if (iVar2 != 0) break;
        }
        goto LAB_002012cf;
      case 'd':
        if (((*(int *)((long)__s + 3) != 0x656c6275 || *__s != 0x756f642d) ||
            (0x2d < (ulong)*(byte *)((long)__s + 7))) ||
           ((0x280000000001U >> ((ulong)*(byte *)((long)__s + 7) & 0x3f) & 1) == 0))
        goto switchD_0020118d_caseD_69;
        break;
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'j':
      case 'k':
      case 'n':
      case 'p':
      case 'q':
      case 'v':
        break;
      case 'i':
      case 'l':
      case 'o':
      case 'u':
switchD_0020118d_caseD_69:
        cVar1 = *(char *)((long)__s + 2);
        goto LAB_00201194;
      case 'm':
        cVar1 = *(char *)((long)__s + 2);
        if (cVar1 == '\0') goto LAB_002012cf;
        if ((cVar1 == 's') || (cVar1 == 'h')) goto LAB_002012c5;
        break;
      case 'r':
        if (*(char *)((long)__s + 2) == '\0') {
          __filename = argv[(long)iVar5 + 1];
          iVar5 = iVar5 + 1;
        }
        else {
          __filename = (char *)((long)__s + 2);
        }
        break;
      case 's':
        if ((*(char *)((long)__s + 2) == '\0') || (*(char *)((long)__s + 2) == 'd'))
        goto LAB_002012cf;
        break;
      case 't':
        cVar1 = *(char *)((long)__s + 2);
        if (cVar1 != 'f') {
          if (cVar1 == 'z') goto LAB_002012cf;
          if (cVar1 != 's') break;
        }
LAB_002012c5:
        cVar1 = *(char *)((long)__s + 3);
LAB_00201194:
        iVar5 = iVar5 + (uint)(cVar1 == '\0');
        break;
      case 'w':
        iVar2 = strcmp((char *)__s,"-webhost");
        if (iVar2 != 0) {
          __s2 = "-websid";
          goto LAB_00201297;
        }
LAB_002012cf:
        iVar5 = iVar5 + 1;
        break;
      default:
        if (cVar1 == 'R') goto switchD_0020118d_caseD_69;
        if ((cVar1 == 'X') && (iVar2 = strcmp((char *)__s,"-Xinterfaces"), iVar2 == 0)) {
          *buf = '\0';
          *engine_type = 3;
          return 1;
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  if (__filename == (char *)0x0) {
    uVar6 = 0;
  }
  else {
    __stream = fopen(__filename,"rb");
    uVar6 = 0;
    if (__stream != (FILE *)0x0) {
      sVar3 = fread(&local_b8,0x10,1,__stream);
      uVar6 = 0;
      if (sVar3 == 1) {
        auVar7[0] = -(local_b8 == 'T');
        auVar7[1] = -(cStack_b7 == 'A');
        auVar7[2] = -(cStack_b6 == 'D');
        auVar7[3] = -(cStack_b5 == 'S');
        auVar7[4] = -(cStack_b4 == '2');
        auVar7[5] = -(cStack_b3 == ' ');
        auVar7[6] = -(cStack_b2 == 's');
        auVar7[7] = -(cStack_b1 == 'a');
        auVar7[8] = -((char)uStack_b0 == 'v');
        auVar7[9] = -(uStack_b0._1_1_ == 'e');
        auVar7[10] = -(cStack_ae == '/');
        auVar7[0xb] = -(cStack_ad == 'g');
        auVar7[0xc] = -(cStack_ac == '\n');
        auVar7[0xd] = -(cStack_ab == '\r');
        auVar7[0xe] = -(cStack_aa == '\x1a');
        auVar7[0xf] = -(cStack_a9 == '\0');
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
          uVar6 = 0;
          iVar5 = fseek(__stream,0x10,0);
          if ((iVar5 == 0) && (sVar3 = fread(&local_b8,2,1,__stream), sVar3 == 1)) {
            uVar4 = (ulong)CONCAT11(cStack_b7,local_b8);
          }
          else {
            uVar4 = 0;
          }
          __size = buflen - 1;
          if (uVar4 < buflen - 1) {
            __size = uVar4;
          }
          sVar3 = fread(buf,__size,1,__stream);
          if (sVar3 == 1) {
            buf[__size] = '\0';
            uVar6 = 1;
          }
        }
        else if (uStack_b0 == 0x762d &&
                 CONCAT17(cStack_b1,
                          CONCAT16(cStack_b2,
                                   CONCAT15(cStack_b3,
                                            CONCAT14(cStack_b4,
                                                     CONCAT13(cStack_b5,
                                                              CONCAT12(cStack_b6,
                                                                       CONCAT11(cStack_b7,local_b8))
                                                             ))))) == 0x65746174732d3354) {
          fseek(__stream,0,0);
          iVar5 = CVmSaveFile::restore_get_image((osfildef *)__stream,buf,buflen);
          uVar6 = (uint)(iVar5 == 0);
        }
      }
      fclose(__stream);
    }
  }
  return uVar6;
}

Assistant:

int vm_get_game_arg(int argc, const char *const *argv,
                    char *buf, size_t buflen, int *engine_type)
{
    /* presume we won't find a file to restore */
    const char *restore_file = 0;

    /* presume we won't identify the engine type based soley on arguments */
    *engine_type = VM_GGT_INVALID;

    /* 
     *   Scan the arguments for the union of the TADS 2 and TADS 3 command
     *   line options.  Start at the second element of the argument vector,
     *   since the first element is the executable name.  Keep going until
     *   we run out of options, each of which must start with a '-'.
     *   
     *   Note that we don't care about the meanings of the options - we
     *   simply want to skip past them.  This is more complicated than
     *   merely looking for the first argument without a '-' prefix, because
     *   some of the options allow arguments, and an option argument can
     *   sometimes - depending on the argument - take the next position in
     *   the argument vector after the option itself.  So, we must determine
     *   the meaning of each option well enough that we can tell whether or
     *   not the next argv element after the option is part of the option.  
     */
    int i;
    for (i = 1 ; i < argc && argv[i][0] == '-' ; ++i)
    {
        /* 
         *   check the first character after the hyphen to determine which
         *   option we have 
         */
        switch(argv[i][1])
        {
        case 'b':
            /* 
             *   tads 3 "-banner" (no arguments, so just consume it and
             *   continue) 
             */
            break;

        case 'c':
            /* 
             *   tads 3 "-cs charset" or "-csl charset"; tads 2 "-ctab-" or
             *   "-ctab tab" 
             */
            if (strcmp(argv[i], "-ctab") == 0
                || strcmp(argv[i], "-cs") == 0
                || strcmp(argv[i], "-csl") == 0)
            {
                /* there's another argument giving the filename */
                ++i;
            }
            break;

        case 'd':
            /* tads 2 "-double[+-]" (no arguments), tads 3 -d <path> */
            if (memcmp(argv[i], "-double", 7) == 0
                && (argv[i][7] == '\0'
                    || argv[i][7] == '+'
                    || argv[i][7] == '-'))
            {
                /* tads 2 -double - no further arguments */
            }
            else if (argv[i][2] == '\0')
            {
                /* tads 3 -d <path> */
                ++i;
            }
            break;

        case 'm':
            /* tads 2 "-msSize", "-mhSize", "-mSize" */
            switch(argv[i][2])
            {
            case 's':
            case 'h':
                /* 
                 *   argument required - if nothing follows the second
                 *   letter, consume the next vector item as the option
                 *   argument 
                 */
                if (argv[i][3] == '\0')
                    ++i;
                break;

            case '\0':
                /* 
                 *   argument required, but nothing follows the "-m" -
                 *   consume the next vector item 
                 */
                ++i;
                break;

            default:
                /* argument required and present */
                break;
            }
            break;

        case 't':
            /* 
             *   tads 2 "-tfFile", "-tsSize", "-tp[+-]", "-t[+0]"; tads3 "-tz
             *   timezone" 
             */
            switch(argv[i][2])
            {
            case 'f':
            case 's':
                /* 
                 *   argument required - consume the next vector item if
                 *   nothing is attached to this item 
                 */
                if (argv[i][3] == '\0')
                    ++i;
                break;
                
            case 'p':
                /* no arguments */
                break;

            case 'z':
                /* -tz - one argument required */
                ++i;
                break;

            default:
                /* no arguments */
                break;
            }
            break;

        case 'u':
            /* 
             *   tads 2 "-uSize" - argument required, so consume the next
             *   vector item if necessary 
             */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'n':
            /* 
             *   tads3 "-ns", "-nobanner", "-norand" take no arguments (-ns
             *   does have extra parameter characters, but they have to be
             *   concatenated as part of the same argv entry, as in "-ns11") 
             */
            break;

        case 's':
            if (argv[i][2] == 'd')
            {
                /* tads 3 -sd <dir> - skip the <dir> parameter */
                ++i;
            }
            else if (argv[i][2] == '\0')
            {
                /* 
                 *   tads 2/3 "-s#" (#=0,1,2,3,4); in tads 2, the # can be
                 *   separated by a space from the -s, so we'll allow it this
                 *   way in general 
                 */
                ++i;
            }
            break;

        case 'i':
            /* tads 2/3 "-iFile" - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'l':
            /* tads 2/3 "-lFile" - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'o':
            /* tads 2/3 "-oFile" - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'p':
            /* tads 2/3 "-plain"; tads 2 "-p[+-]" - no arguments */
            break;

        case 'R':
            /* tads 3 '-Rdir' - consume an argument */
            if (argv[i][2] == '\0')
                ++i;
            break;

        case 'r':
            /* tads 2/3 "-rFile" - consume an argument */
            if (argv[i][2] != '\0')
            {
                /* the file to be restored is appended to the "-r" */
                restore_file = argv[i] + 2;
            }
            else
            {
                /* the file to be restored is the next argument */
                ++i;
                restore_file = argv[i];
            }
            break;

        case 'X':
            /* TADS 3 special system commands */
            if (strcmp(argv[i], "-Xinterfaces") == 0)
            {
                /* 
                 *   this is a stand-alone command that doesn't require a
                 *   game file; return the engine type directly 
                 */
                strcpy_limit(buf, "", buflen);
                *engine_type = VM_GGT_TADS3;
                return TRUE;
            }
            break;

        case 'w':
            /* tads 3 -webhost, -websid */
            if (strcmp(argv[i], "-webhost") == 0
                || strcmp(argv[i], "-websid") == 0)
            {
                /* this takes an additional argument */
                ++i;
            }
            break;
        }
    }

    /*
     *   We have no more options, so the next argument is the game filename.
     *   If we're out of argv elements, then no game filename was directly
     *   specified, in which case we'll try looking for a file spec in the
     *   restore file, if present.  
     */
    if (i < argc)
    {
        /* there's a game file argument - copy it to the caller's buffer */
        strcpy_limit(buf, argv[i], buflen);

        /* return success */
        return TRUE;
    }
    else if (restore_file != 0)
    {
        /* 
         *   There's no game file argument, but there is a restore file
         *   argument.  Try identifying the game file from the original game
         *   file specification stored in the saved state file.  
         */
        return vm_get_game_file_from_savefile(restore_file, buf, buflen);
    }
    else
    {
        /* 
         *   there's no game file or restore file argument, so they've given
         *   us nothing to go on - there's no game file 
         */
        return FALSE;
    }
}